

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O1

void duckdb::
     HistogramFunction<duckdb::DefaultMapType<std::unordered_map<unsigned_short,unsigned_long,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_long>>>>>
     ::
     Combine<duckdb::HistogramAggState<unsigned_short,std::unordered_map<unsigned_short,unsigned_long,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_long>>>>,duckdb::HistogramFunction<duckdb::DefaultMapType<std::unordered_map<unsigned_short,unsigned_long,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_long>>>>>>
               (HistogramAggState<unsigned_short,_std::unordered_map<unsigned_short,_unsigned_long,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_long>_>_>_>
                *source,HistogramAggState<unsigned_short,_std::unordered_map<unsigned_short,_unsigned_long,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_long>_>_>_>
                        *target,AggregateInputData *input_data)

{
  _Hash_node_base *p_Var1;
  unordered_map<unsigned_short,_unsigned_long,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_long>_>_>
  *puVar2;
  mapped_type *pmVar3;
  _Hash_node_base *p_Var4;
  
  if (source->hist !=
      (unordered_map<unsigned_short,_unsigned_long,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_long>_>_>
       *)0x0) {
    if (target->hist ==
        (unordered_map<unsigned_short,_unsigned_long,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_long>_>_>
         *)0x0) {
      puVar2 = (unordered_map<unsigned_short,_unsigned_long,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_long>_>_>
                *)operator_new(0x38);
      (puVar2->_M_h)._M_buckets = (__buckets_ptr)0x0;
      (puVar2->_M_h)._M_bucket_count = 0;
      *(undefined8 *)&(puVar2->_M_h)._M_rehash_policy = 0;
      (puVar2->_M_h)._M_rehash_policy._M_next_resize = 0;
      (puVar2->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (puVar2->_M_h)._M_element_count = 0;
      (puVar2->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
      (puVar2->_M_h)._M_buckets = &(puVar2->_M_h)._M_single_bucket;
      (puVar2->_M_h)._M_bucket_count = 1;
      (puVar2->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
      (puVar2->_M_h)._M_rehash_policy._M_next_resize = 0;
      (puVar2->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
      target->hist = puVar2;
    }
    for (p_Var4 = (source->hist->_M_h)._M_before_begin._M_nxt; p_Var4 != (_Hash_node_base *)0x0;
        p_Var4 = p_Var4->_M_nxt) {
      p_Var1 = p_Var4[2]._M_nxt;
      pmVar3 = ::std::__detail::
               _Map_base<unsigned_short,_std::pair<const_unsigned_short,_unsigned_long>,_std::allocator<std::pair<const_unsigned_short,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_unsigned_long>,_std::allocator<std::pair<const_unsigned_short,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)target->hist,(key_type *)(p_Var4 + 1));
      *pmVar3 = (long)&p_Var1->_M_nxt + *pmVar3;
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &input_data) {
		if (!source.hist) {
			return;
		}
		if (!target.hist) {
			target.hist = MAP_TYPE::CreateEmpty(input_data.allocator);
		}
		for (auto &entry : *source.hist) {
			(*target.hist)[entry.first] += entry.second;
		}
	}